

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

FP16 anon_unknown.dwarf_13fc48::float_to_half_full(FP32 f)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint mant;
  int newexp;
  FP32 f_local;
  FP16 o;
  
  newexp._0_2_ = 0;
  if ((f.u >> 0x17 & 0xff) == 0) {
    newexp._0_2_ = 0;
  }
  else if ((f.u >> 0x17 & 0xff) == 0xff) {
    uVar1 = 0;
    if ((f.u & 0x7fffff) != 0) {
      uVar1 = 0x200;
    }
    newexp._0_2_ = uVar1 | 0x7c00;
  }
  else {
    iVar2 = (f.u >> 0x17 & 0xff) - 0x70;
    if (iVar2 < 0x1f) {
      if (iVar2 < 1) {
        if ((0xe - iVar2 < 0x19) &&
           (uVar3 = f.u & 0x7fffff | 0x800000,
           newexp._0_2_ = (ushort)(uVar3 >> (0xeU - (char)iVar2 & 0x1f)) & 0x3ff,
           (uVar3 >> (0xdU - (char)iVar2 & 0x1f) & 1) != 0)) {
          newexp._0_2_ = (ushort)newexp + 1;
        }
      }
      else {
        newexp._0_2_ = ((ushort)iVar2 & 0x1f) << 10 | (ushort)((int)(f.u & 0x7fffff) >> 0xd);
        if ((f.u & 0x1000) != 0) {
          newexp._0_2_ = (ushort)newexp + 1;
        }
      }
    }
    else {
      newexp._0_2_ = 0x7c00;
    }
  }
  newexp = (int)((ushort)newexp & 0x7fff | (ushort)(f.u >> 0x10) & 0x8000);
  return (FP16)newexp;
}

Assistant:

FP16 float_to_half_full(FP32 f) {
  FP16 o = {0};

  // Based on ISPC reference code (with minor modifications)
  if (f.s.Exponent == 0) // Signed zero/denormal (which will underflow)
    o.s.Exponent = 0;
  else if (f.s.Exponent == 255) // Inf or NaN (all exponent bits set)
  {
    o.s.Exponent = 31;
    o.s.Mantissa = f.s.Mantissa ? 0x200 : 0; // NaN->qNaN and Inf->Inf
  } else                                     // Normalized number
  {
    // Exponent unbias the single, then bias the halfp
    int newexp = f.s.Exponent - 127 + 15;
    if (newexp >= 31) // Overflow, return signed infinity
      o.s.Exponent = 31;
    else if (newexp <= 0) // Underflow
    {
      if ((14 - newexp) <= 24) // Mantissa might be non-zero
      {
        unsigned int mant = f.s.Mantissa | 0x800000; // Hidden 1 bit
        o.s.Mantissa = mant >> (14 - newexp);
        if ((mant >> (13 - newexp)) & 1) // Check for rounding
          o.u++; // Round, might overflow into exp bit, but this is OK
      }
    } else {
      o.s.Exponent = newexp;
      o.s.Mantissa = f.s.Mantissa >> 13;
      if (f.s.Mantissa & 0x1000) // Check for rounding
        o.u++;                   // Round, might overflow to inf, this is OK
    }
  }

  o.s.Sign = f.s.Sign;
  return o;
}